

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O3

void __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::~dht_default_storage
          (dht_default_storage *this)

{
  ~dht_default_storage(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

~dht_default_storage() override = default;